

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbleed.c
# Opt level: O1

int dtls1_process_heartbeat_fixed(SSL *s)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uchar *puVar4;
  uchar *buffer;
  uint write_length;
  uint len;
  uint uVar5;
  
  puVar4 = (s->s3->rrec).data;
  if (s->msg_callback != (_func_void_int_int_int_void_ptr_size_t_void_ptr_void_ptr *)0x0) {
    (*s->msg_callback)(0,s->version,0x18,puVar4,(long)(s->s3->rrec).length,s,s->msg_callback_arg);
  }
  uVar3 = (s->s3->rrec).length;
  if (0x12 < (int)uVar3) {
    bVar1 = puVar4[1];
    uVar5 = (uint)bVar1 * 0x100;
    bVar2 = puVar4[2];
    len = bVar2 + uVar5 + 0x13;
    if (len <= uVar3) {
      uVar5 = uVar5 | bVar2;
      if (*puVar4 == '\x02') {
        if ((uVar5 == 0x12) &&
           ((uint)(ushort)(*(ushort *)(puVar4 + 3) << 8 | *(ushort *)(puVar4 + 3) >> 8) ==
            s->tlsext_hb_seq)) {
          s->tlsext_hb_seq = s->tlsext_hb_seq + 1;
          s->tlsext_hb_pending = 0;
        }
      }
      else if ((*puVar4 == '\x01') && (uVar5 < 0x3fee)) {
        printf("%s : %d bytes\n","unsigned char *OPENSSL_malloc(unsigned int)",(ulong)len);
        buffer = (uchar *)malloc((ulong)len);
        *buffer = '\x02';
        buffer[1] = bVar1;
        buffer[2] = bVar2;
        memcpy(buffer + 3,puVar4 + 3,(ulong)uVar5);
        printf("Response : ");
        print_buffer(buffer,len);
        if (s->msg_callback != (_func_void_int_int_int_void_ptr_size_t_void_ptr_void_ptr *)0x0) {
          (*s->msg_callback)(1,s->version,0x18,buffer,(ulong)len,s,s->msg_callback_arg);
        }
        free(buffer);
      }
    }
  }
  return 0;
}

Assistant:

int
dtls1_process_heartbeat_fixed(SSL *s) {
  unsigned char *p = &s->s3->rrec.data[0], *pl;
  unsigned short hbtype;
  unsigned int payload;
  unsigned int padding = 16; /* Use minimum padding */

  if (s->msg_callback)
    s->msg_callback(0, s->version, TLS1_RT_HEARTBEAT,
                    &s->s3->rrec.data[0], s->s3->rrec.length,
                    s, s->msg_callback_arg);

  /* Read type and payload length first */
  if (1 + 2 + 16 > s->s3->rrec.length)
    return 0; /* silently discard */
  hbtype = *p++;
  n2s(p, payload);
  if (1 + 2 + payload + 16 > s->s3->rrec.length)
    return 0; /* silently discard per RFC 6520 sec. 4 */
  pl = p;

  if (hbtype == TLS1_HB_REQUEST) {
    unsigned char *buffer, *bp;
    unsigned int write_length = 1 /* heartbeat type */ +
                                2 /* heartbeat length */ +
                                payload + padding;
    int r;

    if (write_length > SSL3_RT_MAX_PLAIN_LENGTH)
      return 0;

    /* Allocate memory for the response, size is 1 byte
     * message type, plus 2 bytes payload length, plus
     * payload, plus padding
     */
    buffer = OPENSSL_malloc(write_length);
    bp = buffer;

    /* Enter response type, length and copy payload */
    *bp++ = TLS1_HB_RESPONSE;
    s2n(payload, bp);
    memcpy(bp, pl, payload);
    bp += payload;
    /* Random padding */
    RAND_pseudo_bytes(bp, padding);

    r = dtls1_write_bytes(s, TLS1_RT_HEARTBEAT, buffer, write_length);

    if (r >= 0 && s->msg_callback)
      s->msg_callback(1, s->version, TLS1_RT_HEARTBEAT,
                      buffer, write_length,
                      s, s->msg_callback_arg);

    OPENSSL_free(buffer);

    if (r < 0)
      return r;
  } else if (hbtype == TLS1_HB_RESPONSE) {
    unsigned int seq;

    /* We only send sequence numbers (2 bytes unsigned int),
     * and 16 random bytes, so we just try to read the
     * sequence number */
    n2s(pl, seq);

    if (payload == 18 && seq == s->tlsext_hb_seq) {
      dtls1_stop_timer(s);
      s->tlsext_hb_seq++;
      s->tlsext_hb_pending = 0;
    }
  }

  return 0;
}